

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::R_S<7,_8>::calc(Matrix44 *R,Matrix44 *S,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  Element_Type *pEVar53;
  long in_RDX;
  Matrix44 *in_RSI;
  Matrix44 *in_RDI;
  Temp_Type X137;
  Temp_Type X136;
  Temp_Type X135;
  Temp_Type X134;
  Temp_Type X133;
  Temp_Type X132;
  Temp_Type X131;
  Temp_Type X130;
  Temp_Type X127;
  Temp_Type X126;
  Temp_Type X125;
  Temp_Type X124;
  Temp_Type X123;
  Temp_Type X122;
  Temp_Type X121;
  Temp_Type X120;
  Temp_Type X117;
  Temp_Type X116;
  Temp_Type X115;
  Temp_Type X114;
  Temp_Type X113;
  Temp_Type X112;
  Temp_Type X111;
  Temp_Type X110;
  Temp_Type X107;
  Temp_Type X106;
  Temp_Type X105;
  Temp_Type X104;
  Temp_Type X103;
  Temp_Type X102;
  Temp_Type X101;
  Temp_Type X100;
  
  sVar1 = *(short *)(in_RDX + 2);
  sVar2 = *(short *)(in_RDX + 6);
  sVar3 = *(short *)(in_RDX + 10);
  sVar4 = *(short *)(in_RDX + 0xe);
  iVar41 = *(short *)(in_RDX + 0x12) * 0x3a0 + *(short *)(in_RDX + 0x16) * -0x145 +
           *(short *)(in_RDX + 0x1a) * 0xda + *(short *)(in_RDX + 0x1e) * -0xb8 + 0x200 >> 10;
  sVar5 = *(short *)(in_RDX + 0x22);
  sVar6 = *(short *)(in_RDX + 0x26);
  sVar7 = *(short *)(in_RDX + 0x2a);
  sVar8 = *(short *)(in_RDX + 0x2e);
  iVar42 = *(short *)(in_RDX + 0x32) * 0x3a0 + *(short *)(in_RDX + 0x36) * -0x145 +
           *(short *)(in_RDX + 0x3a) * 0xda + *(short *)(in_RDX + 0x3e) * -0xb8 + 0x200 >> 10;
  sVar9 = *(short *)(in_RDX + 0x42);
  sVar10 = *(short *)(in_RDX + 0x46);
  sVar11 = *(short *)(in_RDX + 0x4a);
  sVar12 = *(short *)(in_RDX + 0x4e);
  iVar43 = *(short *)(in_RDX + 0x52) * 0x3a0 + *(short *)(in_RDX + 0x56) * -0x145 +
           *(short *)(in_RDX + 0x5a) * 0xda + *(short *)(in_RDX + 0x5e) * -0xb8 + 0x200 >> 10;
  sVar13 = *(short *)(in_RDX + 0x62);
  sVar14 = *(short *)(in_RDX + 0x66);
  sVar15 = *(short *)(in_RDX + 0x6a);
  sVar16 = *(short *)(in_RDX + 0x6e);
  sVar17 = *(short *)(in_RDX + 4);
  iVar44 = (int)*(short *)(in_RDX + 0x14);
  sVar18 = *(short *)(in_RDX + 0x24);
  iVar45 = (int)*(short *)(in_RDX + 0x34);
  sVar19 = *(short *)(in_RDX + 0x44);
  iVar46 = (int)*(short *)(in_RDX + 0x54);
  sVar20 = *(short *)(in_RDX + 100);
  sVar21 = *(short *)(in_RDX + 2);
  sVar22 = *(short *)(in_RDX + 6);
  sVar23 = *(short *)(in_RDX + 10);
  sVar24 = *(short *)(in_RDX + 0xe);
  iVar47 = *(short *)(in_RDX + 0x12) * -0x4b + *(short *)(in_RDX + 0x16) * 0x20e +
           *(short *)(in_RDX + 0x1a) * 0x313 + *(short *)(in_RDX + 0x1e) * -0x17f + 0x200 >> 10;
  sVar25 = *(short *)(in_RDX + 0x22);
  sVar26 = *(short *)(in_RDX + 0x26);
  sVar27 = *(short *)(in_RDX + 0x2a);
  sVar28 = *(short *)(in_RDX + 0x2e);
  iVar48 = *(short *)(in_RDX + 0x32) * -0x4b + *(short *)(in_RDX + 0x36) * 0x20e +
           *(short *)(in_RDX + 0x3a) * 0x313 + *(short *)(in_RDX + 0x3e) * -0x17f + 0x200 >> 10;
  sVar29 = *(short *)(in_RDX + 0x42);
  sVar30 = *(short *)(in_RDX + 0x46);
  sVar31 = *(short *)(in_RDX + 0x4a);
  sVar32 = *(short *)(in_RDX + 0x4e);
  iVar49 = *(short *)(in_RDX + 0x52) * -0x4b + *(short *)(in_RDX + 0x56) * 0x20e +
           *(short *)(in_RDX + 0x5a) * 0x313 + *(short *)(in_RDX + 0x5e) * -0x17f + 0x200 >> 10;
  sVar33 = *(short *)(in_RDX + 0x62);
  sVar34 = *(short *)(in_RDX + 0x66);
  sVar35 = *(short *)(in_RDX + 0x6a);
  sVar36 = *(short *)(in_RDX + 0x6e);
  sVar37 = *(short *)(in_RDX + 0xc);
  iVar50 = (int)*(short *)(in_RDX + 0x1c);
  sVar38 = *(short *)(in_RDX + 0x2c);
  iVar51 = (int)*(short *)(in_RDX + 0x3c);
  sVar39 = *(short *)(in_RDX + 0x4c);
  iVar52 = (int)*(short *)(in_RDX + 0x5c);
  sVar40 = *(short *)(in_RDX + 0x6c);
  pEVar53 = Matrix44::at(in_RDI,0,0);
  *pEVar53 = sVar1 * 0x3a0 + sVar2 * -0x145 + sVar3 * 0xda + sVar4 * -0xb8 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,0,1);
  *pEVar53 = iVar41 * 0x1aa + iVar42 * 0x32a + iVar43 * -0x168 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,0,2);
  *pEVar53 = sVar9 * 0x3a0 + sVar10 * -0x145 + sVar11 * 0xda + sVar12 * -0xb8 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,0,3);
  *pEVar53 = iVar41 * 0x17 + iVar42 * -99 + iVar43 * 0x1f6 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,1,0);
  *pEVar53 = (int)sVar17;
  pEVar53 = Matrix44::at(in_RDI,1,1);
  *pEVar53 = iVar44 * 0x1aa + iVar45 * 0x32a + iVar46 * -0x168 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,1,2);
  *pEVar53 = (int)sVar19;
  pEVar53 = Matrix44::at(in_RDI,1,3);
  *pEVar53 = iVar44 * 0x17 + iVar45 * -99 + iVar46 * 0x1f6 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,2,0);
  *pEVar53 = sVar21 * -0x4b + sVar22 * 0x20e + sVar23 * 0x313 + sVar24 * -0x17f + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,2,1);
  *pEVar53 = iVar47 * 0x1aa + iVar48 * 0x32a + iVar49 * -0x168 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,2,2);
  *pEVar53 = sVar29 * -0x4b + sVar30 * 0x20e + sVar31 * 0x313 + sVar32 * -0x17f + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,2,3);
  *pEVar53 = iVar47 * 0x17 + iVar48 * -99 + iVar49 * 0x1f6 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,3,0);
  *pEVar53 = (int)sVar37;
  pEVar53 = Matrix44::at(in_RDI,3,1);
  *pEVar53 = iVar50 * 0x1aa + iVar51 * 0x32a + iVar52 * -0x168 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RDI,3,2);
  *pEVar53 = (int)sVar39;
  pEVar53 = Matrix44::at(in_RDI,3,3);
  *pEVar53 = iVar50 * 0x17 + iVar51 * -99 + iVar52 * 0x1f6 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,0,0);
  *pEVar53 = iVar41 * 0x3a0 + iVar42 * -0x145 + iVar43 * 0xda + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,0,1);
  *pEVar53 = sVar5 * 0x3a0 + sVar6 * -0x145 + sVar7 * 0xda + sVar8 * -0xb8 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,0,2);
  *pEVar53 = iVar41 * -0x4b + iVar42 * 0x20e + iVar43 * 0x313 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,0,3);
  *pEVar53 = sVar13 * 0x3a0 + sVar14 * -0x145 + sVar15 * 0xda + sVar16 * -0xb8 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,1,0);
  *pEVar53 = iVar44 * 0x3a0 + iVar45 * -0x145 + iVar46 * 0xda + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,1,1);
  *pEVar53 = (int)sVar18;
  pEVar53 = Matrix44::at(in_RSI,1,2);
  *pEVar53 = iVar44 * -0x4b + iVar45 * 0x20e + iVar46 * 0x313 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,1,3);
  *pEVar53 = (int)sVar20;
  pEVar53 = Matrix44::at(in_RSI,2,0);
  *pEVar53 = iVar47 * 0x3a0 + iVar48 * -0x145 + iVar49 * 0xda + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,2,1);
  *pEVar53 = sVar25 * -0x4b + sVar26 * 0x20e + sVar27 * 0x313 + sVar28 * -0x17f + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,2,2);
  *pEVar53 = iVar47 * -0x4b + iVar48 * 0x20e + iVar49 * 0x313 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,2,3);
  *pEVar53 = sVar33 * -0x4b + sVar34 * 0x20e + sVar35 * 0x313 + sVar36 * -0x17f + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,3,0);
  *pEVar53 = iVar50 * 0x3a0 + iVar51 * -0x145 + iVar52 * 0xda + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,3,1);
  *pEVar53 = (int)sVar38;
  pEVar53 = Matrix44::at(in_RSI,3,2);
  *pEVar53 = iVar50 * -0x4b + iVar51 * 0x20e + iVar52 * 0x313 + 0x200 >> 10;
  pEVar53 = Matrix44::at(in_RSI,3,3);
  *pEVar53 = (int)sVar40;
  return;
}

Assistant:

static void calc(Matrix44& R, Matrix44& S, const jpgd_block_t* pSrc) {
    // 4x8 = 4x8 times 8x8, matrix 0 is constant
    const Temp_Type X100 = D(F(0.906127f) * AT(1, 0) + F(-0.318190f) * AT(3, 0) + F(0.212608f) * AT(5, 0) + F(-0.180240f) * AT(7, 0));
    const Temp_Type X101 = D(F(0.906127f) * AT(1, 1) + F(-0.318190f) * AT(3, 1) + F(0.212608f) * AT(5, 1) + F(-0.180240f) * AT(7, 1));
    const Temp_Type X102 = D(F(0.906127f) * AT(1, 2) + F(-0.318190f) * AT(3, 2) + F(0.212608f) * AT(5, 2) + F(-0.180240f) * AT(7, 2));
    const Temp_Type X103 = D(F(0.906127f) * AT(1, 3) + F(-0.318190f) * AT(3, 3) + F(0.212608f) * AT(5, 3) + F(-0.180240f) * AT(7, 3));
    const Temp_Type X104 = D(F(0.906127f) * AT(1, 4) + F(-0.318190f) * AT(3, 4) + F(0.212608f) * AT(5, 4) + F(-0.180240f) * AT(7, 4));
    const Temp_Type X105 = D(F(0.906127f) * AT(1, 5) + F(-0.318190f) * AT(3, 5) + F(0.212608f) * AT(5, 5) + F(-0.180240f) * AT(7, 5));
    const Temp_Type X106 = D(F(0.906127f) * AT(1, 6) + F(-0.318190f) * AT(3, 6) + F(0.212608f) * AT(5, 6) + F(-0.180240f) * AT(7, 6));
    const Temp_Type X107 = D(F(0.906127f) * AT(1, 7) + F(-0.318190f) * AT(3, 7) + F(0.212608f) * AT(5, 7) + F(-0.180240f) * AT(7, 7));
    const Temp_Type X110 = AT(2, 0);
    const Temp_Type X111 = AT(2, 1);
    const Temp_Type X112 = AT(2, 2);
    const Temp_Type X113 = AT(2, 3);
    const Temp_Type X114 = AT(2, 4);
    const Temp_Type X115 = AT(2, 5);
    const Temp_Type X116 = AT(2, 6);
    const Temp_Type X117 = AT(2, 7);
    const Temp_Type X120 = D(F(-0.074658f) * AT(1, 0) + F(0.513280f) * AT(3, 0) + F(0.768178f) * AT(5, 0) + F(-0.375330f) * AT(7, 0));
    const Temp_Type X121 = D(F(-0.074658f) * AT(1, 1) + F(0.513280f) * AT(3, 1) + F(0.768178f) * AT(5, 1) + F(-0.375330f) * AT(7, 1));
    const Temp_Type X122 = D(F(-0.074658f) * AT(1, 2) + F(0.513280f) * AT(3, 2) + F(0.768178f) * AT(5, 2) + F(-0.375330f) * AT(7, 2));
    const Temp_Type X123 = D(F(-0.074658f) * AT(1, 3) + F(0.513280f) * AT(3, 3) + F(0.768178f) * AT(5, 3) + F(-0.375330f) * AT(7, 3));
    const Temp_Type X124 = D(F(-0.074658f) * AT(1, 4) + F(0.513280f) * AT(3, 4) + F(0.768178f) * AT(5, 4) + F(-0.375330f) * AT(7, 4));
    const Temp_Type X125 = D(F(-0.074658f) * AT(1, 5) + F(0.513280f) * AT(3, 5) + F(0.768178f) * AT(5, 5) + F(-0.375330f) * AT(7, 5));
    const Temp_Type X126 = D(F(-0.074658f) * AT(1, 6) + F(0.513280f) * AT(3, 6) + F(0.768178f) * AT(5, 6) + F(-0.375330f) * AT(7, 6));
    const Temp_Type X127 = D(F(-0.074658f) * AT(1, 7) + F(0.513280f) * AT(3, 7) + F(0.768178f) * AT(5, 7) + F(-0.375330f) * AT(7, 7));
    const Temp_Type X130 = AT(6, 0);
    const Temp_Type X131 = AT(6, 1);
    const Temp_Type X132 = AT(6, 2);
    const Temp_Type X133 = AT(6, 3);
    const Temp_Type X134 = AT(6, 4);
    const Temp_Type X135 = AT(6, 5);
    const Temp_Type X136 = AT(6, 6);
    const Temp_Type X137 = AT(6, 7);
    // 80 muls 48 adds

    // 4x4 = 4x8 times 8x4, matrix 1 is constant
    R.at(0, 0) = X100;
    R.at(0, 1) = D(X101 * F(0.415735f) + X103 * F(0.791065f) + X105 * F(-0.352443f) + X107 * F(0.277785f));
    R.at(0, 2) = X104;
    R.at(0, 3) = D(X101 * F(0.022887f) + X103 * F(-0.097545f) + X105 * F(0.490393f) + X107 * F(0.865723f));
    R.at(1, 0) = X110;
    R.at(1, 1) = D(X111 * F(0.415735f) + X113 * F(0.791065f) + X115 * F(-0.352443f) + X117 * F(0.277785f));
    R.at(1, 2) = X114;
    R.at(1, 3) = D(X111 * F(0.022887f) + X113 * F(-0.097545f) + X115 * F(0.490393f) + X117 * F(0.865723f));
    R.at(2, 0) = X120;
    R.at(2, 1) = D(X121 * F(0.415735f) + X123 * F(0.791065f) + X125 * F(-0.352443f) + X127 * F(0.277785f));
    R.at(2, 2) = X124;
    R.at(2, 3) = D(X121 * F(0.022887f) + X123 * F(-0.097545f) + X125 * F(0.490393f) + X127 * F(0.865723f));
    R.at(3, 0) = X130;
    R.at(3, 1) = D(X131 * F(0.415735f) + X133 * F(0.791065f) + X135 * F(-0.352443f) + X137 * F(0.277785f));
    R.at(3, 2) = X134;
    R.at(3, 3) = D(X131 * F(0.022887f) + X133 * F(-0.097545f) + X135 * F(0.490393f) + X137 * F(0.865723f));
    // 40 muls 24 adds
    // 4x4 = 4x8 times 8x4, matrix 1 is constant
    S.at(0, 0) = D(X101 * F(0.906127f) + X103 * F(-0.318190f) + X105 * F(0.212608f) + X107 * F(-0.180240f));
    S.at(0, 1) = X102;
    S.at(0, 2) = D(X101 * F(-0.074658f) + X103 * F(0.513280f) + X105 * F(0.768178f) + X107 * F(-0.375330f));
    S.at(0, 3) = X106;
    S.at(1, 0) = D(X111 * F(0.906127f) + X113 * F(-0.318190f) + X115 * F(0.212608f) + X117 * F(-0.180240f));
    S.at(1, 1) = X112;
    S.at(1, 2) = D(X111 * F(-0.074658f) + X113 * F(0.513280f) + X115 * F(0.768178f) + X117 * F(-0.375330f));
    S.at(1, 3) = X116;
    S.at(2, 0) = D(X121 * F(0.906127f) + X123 * F(-0.318190f) + X125 * F(0.212608f) + X127 * F(-0.180240f));
    S.at(2, 1) = X122;
    S.at(2, 2) = D(X121 * F(-0.074658f) + X123 * F(0.513280f) + X125 * F(0.768178f) + X127 * F(-0.375330f));
    S.at(2, 3) = X126;
    S.at(3, 0) = D(X131 * F(0.906127f) + X133 * F(-0.318190f) + X135 * F(0.212608f) + X137 * F(-0.180240f));
    S.at(3, 1) = X132;
    S.at(3, 2) = D(X131 * F(-0.074658f) + X133 * F(0.513280f) + X135 * F(0.768178f) + X137 * F(-0.375330f));
    S.at(3, 3) = X136;
    // 40 muls 24 adds
  }